

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O1

void __thiscall arm::BrInst::display(BrInst *this,ostream *o)

{
  display_op((this->super_Inst).op,o);
  display_cond((this->super_Inst).cond,o);
  std::__ostream_insert<char,std::char_traits<char>>(o," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,(this->l)._M_dataplus._M_p,(this->l)._M_string_length);
  return;
}

Assistant:

void BrInst::display(std::ostream &o) const {
  display_op(op, o);
  display_cond(cond, o);
  o << " " << l;
}